

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_compute_pipeline
               (StateRecorder *recorder,VkComputePipelineCreateInfo *create_info,Hash *out_hash)

{
  byte bVar1;
  VkShaderModule module;
  VkSpecializationInfo *spec;
  bool bVar2;
  ulong uVar3;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  int *piVar4;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar5;
  byte *pbVar6;
  ulong uVar7;
  Hash hash;
  Hasher local_38;
  ulong local_30;
  
  if ((create_info->stage).pName != (char *)0x0) {
    uVar7 = 0xcbf29ce484222325;
    local_38.h = 0xcbf29ce484222325;
    bVar2 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&local_30);
    if (!bVar2) {
      return false;
    }
    uVar3 = (local_30 & 0xffffffff ^ local_38.h * 0x100000001b3) * 0x100000001b3 ^ local_30 >> 0x20;
    for (piVar4 = (int *)create_info->pNext; piVar4 != (int *)0x0; piVar4 = *(int **)(piVar4 + 2)) {
      if (*piVar4 == 0x3ba1f5f5) goto LAB_0014d284;
    }
    piVar4 = (int *)0x0;
LAB_0014d284:
    if (piVar4 == (int *)0x0) {
      local_38.h = uVar3 * 0x100000001b3 ^ (ulong)(create_info->flags & 0x7ffffc3f);
    }
    else {
      local_38.h = uVar3 * 0x100000001b3;
    }
    if (((create_info->flags & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
      local_38.h = local_38.h * 0x100000001b3;
    }
    else {
      bVar2 = StateRecorder::get_hash_for_compute_pipeline_handle
                        (recorder,create_info->basePipelineHandle,&local_30);
      if (!bVar2) {
        return false;
      }
      local_38.h = ((local_30 & 0xffffffff ^ local_38.h * 0x100000001b3) * 0x100000001b3 ^
                   local_30 >> 0x20) * 0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
    }
    module = (create_info->stage).module;
    if (module == (VkShaderModule)0x0) {
      info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)(create_info->stage).pNext;
      for (pVVar5 = info; pVVar5 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
          pVVar5 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)pVVar5->pNext) {
        if (pVVar5->sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) goto LAB_0014d356;
      }
      pVVar5 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
LAB_0014d356:
      if (pVVar5 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        if (pVVar5->pIdentifier < (uint8_t *)0x4) {
          local_30 = 0xaf63bd4c8601b7df;
        }
        else {
          uVar3 = 0;
          do {
            uVar7 = (ulong)*(uint *)(*(long *)(pVVar5 + 1) + uVar3 * 4) ^ uVar7 * 0x100000001b3;
            uVar3 = uVar3 + 1;
          } while ((ulong)pVVar5->pIdentifier >> 2 != uVar3);
          local_30 = uVar7 * 0x100000001b3;
        }
        local_30 = pVVar5->identifierSize ^ local_30;
        goto LAB_0014d3c9;
      }
      for (; info != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
          info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)info->pNext) {
        if (info->sType == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT
           ) goto LAB_0014d4a8;
      }
      info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
LAB_0014d4a8:
      if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        return false;
      }
      bVar2 = StateRecorder::Impl::get_hash_for_shader_module(recorder->impl,info,&local_30);
    }
    else {
      bVar2 = StateRecorder::get_hash_for_shader_module(recorder,module,&local_30);
    }
    if (bVar2 != false) {
LAB_0014d3c9:
      pbVar6 = (byte *)(create_info->stage).pName;
      uVar7 = ((local_30 & 0xffffffff ^ local_38.h * 0x100000001b3) * 0x100000001b3 ^
              local_30 >> 0x20) * 0x100000001b3 ^ 0xff;
      bVar1 = *pbVar6;
      while (bVar1 != 0) {
        pbVar6 = pbVar6 + 1;
        uVar7 = uVar7 * 0x100000001b3 ^ (ulong)bVar1;
        bVar1 = *pbVar6;
      }
      local_38.h = (uVar7 * 0x100000001b3 ^ (ulong)(create_info->stage).flags) * 0x100000001b3 ^
                   (ulong)(create_info->stage).stage;
      spec = (create_info->stage).pSpecializationInfo;
      if (spec == (VkSpecializationInfo *)0x0) {
        local_38.h = local_38.h * 0x100000001b3;
      }
      else {
        hash_specialization_info(&local_38,spec);
      }
      bVar2 = hash_pnext_chain(recorder,&local_38,(create_info->stage).pNext,(DynamicStateInfo *)0x0
                               ,0);
      if (bVar2) {
        bVar2 = hash_pnext_chain(recorder,&local_38,create_info->pNext,(DynamicStateInfo *)0x0,0);
        if (bVar2) {
          *out_hash = local_38.h;
          return true;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool compute_hash_compute_pipeline(const StateRecorder &recorder, const VkComputePipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	if (!create_info.stage.pName)
		return false;

	Hasher h;
	Hash hash;

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_compute_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	// Unfortunately, the hash order is incompatible with compute_hash_stage().
	// For compatibility, cannot change this without a clean break.
	if (create_info.stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(create_info.stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, create_info.stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, create_info.stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	h.string(create_info.stage.pName);
	h.u32(create_info.stage.flags);
	h.u32(create_info.stage.stage);

	if (create_info.stage.pSpecializationInfo)
		hash_specialization_info(h, *create_info.stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.stage.pNext, nullptr, 0))
		return false;

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}